

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O0

char * __thiscall boost::system::system_error::what(system_error *this)

{
  ulong uVar1;
  char *pcVar2;
  long in_RDI;
  string local_40 [8];
  error_code *in_stack_ffffffffffffffc8;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    pcVar2 = (char *)std::runtime_error::what();
    std::__cxx11::string::operator=((string *)(in_RDI + 0x20),pcVar2);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)(in_RDI + 0x20),": ");
    }
    error_code::message_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0x20),local_40);
    std::__cxx11::string::~string(local_40);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

inline const char * system_error::what() const BOOST_NOEXCEPT_OR_NOTHROW
    // see http://www.boost.org/more/error_handling.html for lazy build rationale
    {
      if ( m_what.empty() )
      {
#ifndef BOOST_NO_EXCEPTIONS
        try
#endif
        {
          m_what = this->std::runtime_error::what();
          if ( !m_what.empty() ) m_what += ": ";
          m_what += m_error_code.message();
        }
#ifndef BOOST_NO_EXCEPTIONS
        catch (...) { return std::runtime_error::what(); }
#endif
      }
      return m_what.c_str();
    }